

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodeSystemPStateInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint Value;
  _Bool ValidNamed;
  _Bool local_19;
  
  Value = insn >> 0xd & 0x38 | insn >> 5 & 7;
  MCOperand_CreateImm0(Inst,(ulong)Value);
  MCOperand_CreateImm0(Inst,(ulong)(insn >> 8 & 0xf));
  A64NamedImmMapper_toString(&A64PState_PStateMapper,Value,&local_19);
  return (uint)local_19 + (uint)local_19 * 2;
}

Assistant:

static DecodeStatus DecodeSystemPStateInstruction(MCInst *Inst,
		uint32_t insn, uint64_t Addr,
		const void *Decoder)
{
	uint32_t op1 = fieldFromInstruction(insn, 16, 3);
	uint32_t op2 = fieldFromInstruction(insn, 5, 3);
	uint32_t crm = fieldFromInstruction(insn, 8, 4);
	bool ValidNamed;
	uint32_t pstate_field = (op1 << 3) | op2;

	MCOperand_CreateImm0(Inst, pstate_field);
	MCOperand_CreateImm0(Inst, crm);

	A64NamedImmMapper_toString(&A64PState_PStateMapper, pstate_field, &ValidNamed);

	return ValidNamed ? Success : Fail;
}